

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.c
# Opt level: O0

int is_last_day_in_month(int year,int month,int day)

{
  int *days;
  int day_local;
  int month_local;
  int year_local;
  uint local_4;
  
  if ((year % 4 == 0) && (year % 100 != 0)) {
    days = days_in_a_month_l;
  }
  else {
    days = days_in_a_month;
  }
  local_4 = (uint)(day == days[month + -1]);
  return local_4;
}

Assistant:

int
is_last_day_in_month(int year,int month,int day){
    int * days;
    if(LEAP(year))
      days = days_in_a_month_l;
    else
      days = days_in_a_month;
    if(day ==  days[month-1]) return 1;
    return 0;
}